

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall common_log::set_file(common_log *this,char *path)

{
  FILE *pFVar1;
  
  pause(this);
  if ((FILE *)this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  if (path == (char *)0x0) {
    pFVar1 = (FILE *)0x0;
  }
  else {
    pFVar1 = fopen(path,"w");
  }
  this->file = (FILE *)pFVar1;
  resume(this);
  return;
}

Assistant:

void set_file(const char * path) {
        pause();

        if (file) {
            fclose(file);
        }

        if (path) {
            file = fopen(path, "w");
        } else {
            file = nullptr;
        }

        resume();
    }